

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O1

void __thiscall
duckdb::RowGroupCollection::FinalizeAppend
          (RowGroupCollection *this,TransactionData transaction,TableAppendState *state)

{
  RowGroup *pRVar1;
  RowGroup *row_group_start;
  TransactionData transaction_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  RowVersionManager *this_00;
  RowGroupSegmentTree *this_01;
  TableAppendState *pTVar4;
  reference pvVar5;
  type this_02;
  type this_03;
  DistinctStatistics *this_04;
  DistinctStatistics *other;
  RowGroup *row_group_end;
  ulong uVar6;
  TableAppendState *this_05;
  size_type __n;
  ulong uVar7;
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
  global_stats_lock;
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
  local_stats_lock;
  TableStatistics local_68;
  idx_t local_38;
  
  local_68.table_sample.
  super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
  super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>.
  super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl =
       (unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>)
       &state->total_append_count;
  uVar6 = state->total_append_count;
  local_68.stats_lock.internal.super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)state;
  if (uVar6 != 0) {
    local_38 = this->row_group_size;
    this_05 = (TableAppendState *)state->start_row_group;
    do {
      uVar7 = local_38 - (long)(this_05->row_group_append_state).row_group;
      if (uVar6 < uVar7) {
        uVar7 = uVar6;
      }
      local_68.column_stats.
      super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
      .
      super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)transaction.start_time;
      local_68.column_stats.
      super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
      .
      super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)transaction.transaction.ptr;
      local_68.column_stats.
      super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
      .
      super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)transaction.transaction_id;
      row_group_end =
           *(RowGroup **)
            ((long)&(((this_05->append_lock)._M_device)->super___mutex_base)._M_mutex + 8);
      row_group_start = (this_05->row_group_append_state).row_group;
      pRVar1 = (RowGroup *)
               ((long)&(row_group_start->super_SegmentBase<duckdb::RowGroup>).start + uVar7);
      if (pRVar1 < row_group_end) {
        row_group_end = pRVar1;
      }
      this_00 = RowGroup::GetOrCreateVersionInfo((RowGroup *)this_05);
      transaction_00.transaction_id =
           (transaction_t)
           local_68.column_stats.
           super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
           .
           super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      transaction_00.transaction.ptr =
           (DuckTransaction *)
           local_68.column_stats.
           super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
           .
           super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      transaction_00.start_time =
           (transaction_t)
           local_68.column_stats.
           super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
           .
           super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      RowVersionManager::AppendVersionInfo
                (this_00,transaction_00,(idx_t)state,(idx_t)row_group_start,(idx_t)row_group_end);
      LOCK();
      (this_05->row_group_append_state).row_group = row_group_end;
      UNLOCK();
      this_01 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
      pTVar4 = (TableAppendState *)
               SegmentTree<duckdb::RowGroup,_true>::GetNextSegment
                         (&this_01->super_SegmentTree<duckdb::RowGroup,_true>,(RowGroup *)this_05);
      uVar6 = uVar6 - uVar7;
      state = this_05;
      this_05 = pTVar4;
    } while (uVar6 != 0);
  }
  _Var2._M_pi = local_68.stats_lock.internal.
                super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  LOCK();
  (this->total_rows).super___atomic_base<unsigned_long>._M_i =
       (this->total_rows).super___atomic_base<unsigned_long>._M_i +
       (long)local_68.stats_lock.internal.super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi[4]._vptr__Sp_counted_base;
  UNLOCK();
  *(idx_t *)local_68.table_sample.
            super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>.
            _M_t.
            super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
            .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl = 0;
  *(RowGroup **)
   ((long)local_68.table_sample.
          super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
          .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl + 8) =
       (RowGroup *)0x0;
  TableStatistics::GetLock((TableStatistics *)&local_68.column_stats);
  TableStatistics::GetLock(&local_68);
  if ((this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
      ::operator*((unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
                   *)&local_68);
      pvVar5 = vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_true>::operator[]
                         (&(this->stats).column_stats,__n);
      this_02 = shared_ptr<duckdb::ColumnStatistics,_true>::operator*(pvVar5);
      bVar3 = ColumnStatistics::HasDistinctStats(this_02);
      if (bVar3) {
        unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
        ::operator*((unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
                     *)&local_68.column_stats);
        pvVar5 = vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_true>::operator[]
                           ((vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_true> *)
                            &_Var2._M_pi[7]._M_use_count,__n);
        this_03 = shared_ptr<duckdb::ColumnStatistics,_true>::operator*(pvVar5);
        bVar3 = ColumnStatistics::HasDistinctStats(this_03);
        if (bVar3) {
          this_04 = ColumnStatistics::DistinctStats(this_02);
          other = ColumnStatistics::DistinctStats(this_03);
          DistinctStatistics::Merge(this_04,other);
        }
      }
      __n = __n + 1;
    } while (__n < (ulong)(((long)(this->types).
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->types).
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555));
  }
  ::std::unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
  ::~unique_ptr((unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
                 *)&local_68);
  ::std::unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
  ::~unique_ptr((unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
                 *)&local_68.column_stats);
  return;
}

Assistant:

void RowGroupCollection::FinalizeAppend(TransactionData transaction, TableAppendState &state) {
	const idx_t row_group_size = GetRowGroupSize();

	auto remaining = state.total_append_count;
	auto row_group = state.start_row_group;
	while (remaining > 0) {
		auto append_count = MinValue<idx_t>(remaining, row_group_size - row_group->count);
		row_group->AppendVersionInfo(transaction, append_count);
		remaining -= append_count;
		row_group = row_groups->GetNextSegment(row_group);
	}
	total_rows += state.total_append_count;

	state.total_append_count = 0;
	state.start_row_group = nullptr;

	auto local_stats_lock = state.stats.GetLock();
	auto global_stats_lock = stats.GetLock();
	for (idx_t col_idx = 0; col_idx < types.size(); col_idx++) {
		auto &global_stats = stats.GetStats(*global_stats_lock, col_idx);
		if (!global_stats.HasDistinctStats()) {
			continue;
		}
		auto &local_stats = state.stats.GetStats(*local_stats_lock, col_idx);
		if (!local_stats.HasDistinctStats()) {
			continue;
		}
		global_stats.DistinctStats().Merge(local_stats.DistinctStats());
	}

	Verify();
}